

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

Status __thiscall spvtools::opt::AmdExtensionToKhrPass::Process(AmdExtensionToKhrPass *this)

{
  IRContext *ctx;
  IRContext *ctx_00;
  Module *pMVar1;
  pointer puVar2;
  Instruction *pIVar3;
  AmdExtensionToKhrPass *pAVar4;
  pointer ppIVar5;
  __uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
  this_00;
  __uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
  this_01;
  Operand *pOVar6;
  size_type sVar7;
  Status SVar8;
  long lVar9;
  pointer ppIVar10;
  pointer puVar11;
  Instruction *inst_1;
  Instruction **ppIVar12;
  Instruction *inst;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool changed;
  allocator_type local_104;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  AmdExtensionToKhrPass *local_100;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_be_killed;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  string local_b8 [32];
  string local_98 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_to_remove;
  InstructionFolder folder;
  
  changed = false;
  ctx = (this->super_Pass).context_;
  this_00.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
        )::operator_new(0x90);
  FoldingRules::FoldingRules
            ((FoldingRules *)
             this_00.
             super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl,ctx);
  *(undefined ***)
   this_00.
   super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
   .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       &PTR__FoldingRules_00a6dd58;
  ctx_00 = (this->super_Pass).context_;
  this_01.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
        )::operator_new(0x90);
  ConstantFoldingRules::ConstantFoldingRules
            ((ConstantFoldingRules *)
             this_01.
             super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl,
             ctx_00);
  *(undefined ***)
   this_01.
   super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
   .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       &PTR__ConstantFoldingRules_00a6dd98;
  folder.context_ = ctx;
  folder.const_folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
          )this_01.
           super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
           .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl;
  folder.folding_rules_._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
           .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl;
  (**(code **)(*(long *)this_00.
                        super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl +
              0x10))(this_00.
                     super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                     .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl);
  (**(code **)(*(long *)this_01.
                        super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>.
                        _M_head_impl + 0x10))
            (this_01.
             super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
             .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  local_100 = this;
  for (puVar11 = *(pointer *)
                  &(pMVar1->functions_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                   ._M_impl; puVar11 != puVar2; puVar11 = puVar11 + 1) {
    local_d8._M_unused._M_object = &changed;
    local_c0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp:932:22)>
               ::_M_manager;
    local_d8._8_8_ = &folder;
    opt::Function::ForEachInst
              ((Function *)
               (puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
               ,(function<void_(spvtools::opt::Instruction_*)> *)&local_d8,false,false);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8._M_pod_data,"SPV_AMD_shader_ballot",(allocator<char> *)&to_be_killed
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"SPV_AMD_shader_trinary_minmax",&local_101);
  std::__cxx11::string::string<std::allocator<char>>(local_98,"SPV_AMD_gcn_shader",&local_102);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_d8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&ext_to_remove,__l,&local_103,&local_104);
  lVar9 = 0x40;
  do {
    std::__cxx11::string::_M_dispose();
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x20);
  to_be_killed.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_be_killed.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_be_killed.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (((local_100->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar12 = (Instruction **)
             ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar3 = *ppIVar12,
        pIVar3 != (Instruction *)
                  ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8U
                  )) {
    if (pIVar3->opcode_ == OpExtension) {
      pOVar6 = Instruction::GetInOperand(pIVar3,0);
      Operand::AsString_abi_cxx11_((string *)&local_d8,pOVar6);
      sVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&ext_to_remove,(key_type *)&local_d8);
      std::__cxx11::string::_M_dispose();
      if (sVar7 != 0) {
        local_d8._M_unused._0_8_ = (undefined8)pIVar3;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&to_be_killed,(Instruction **)&local_d8);
      }
    }
    ppIVar12 = &(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (((local_100->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar12 = (Instruction **)
             ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  while (ppIVar5 = to_be_killed.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pAVar4 = local_100,
        pIVar3 = *ppIVar12,
        ppIVar10 = to_be_killed.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        pIVar3 != (Instruction *)
                  ((long)&(pMVar1->ext_inst_imports_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    if (pIVar3->opcode_ == OpExtInstImport) {
      pOVar6 = Instruction::GetInOperand(pIVar3,0);
      Operand::AsString_abi_cxx11_((string *)&local_d8,pOVar6);
      sVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&ext_to_remove,(key_type *)&local_d8);
      std::__cxx11::string::_M_dispose();
      if (sVar7 != 0) {
        local_d8._M_unused._0_8_ = (undefined8)pIVar3;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&to_be_killed,(Instruction **)&local_d8);
      }
    }
    ppIVar12 = &(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  for (; ppIVar10 != ppIVar5; ppIVar10 = ppIVar10 + 1) {
    IRContext::KillInst((pAVar4->super_Pass).context_,*ppIVar10);
    changed = true;
  }
  if (changed == false) {
    SVar8 = SuccessWithoutChange;
  }
  else {
    pMVar1 = (((pAVar4->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    SVar8 = SuccessWithChange;
    if ((pMVar1->header_).version < 0x10300) {
      (pMVar1->header_).version = 0x10300;
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&to_be_killed.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&ext_to_remove._M_t);
  InstructionFolder::~InstructionFolder(&folder);
  return SVar8;
}

Assistant:

Pass::Status AmdExtensionToKhrPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<AmdExtFoldingRules>(new AmdExtFoldingRules(context())),
      MakeUnique<AmdExtConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  // Now that instruction that require the extensions have been removed, we can
  // remove the extension instructions.
  std::set<std::string> ext_to_remove = {"SPV_AMD_shader_ballot",
                                         "SPV_AMD_shader_trinary_minmax",
                                         "SPV_AMD_gcn_shader"};

  std::vector<Instruction*> to_be_killed;
  for (Instruction& inst : context()->module()->extensions()) {
    if (inst.opcode() == spv::Op::OpExtension) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction& inst : context()->ext_inst_imports()) {
    if (inst.opcode() == spv::Op::OpExtInstImport) {
      if (ext_to_remove.count(inst.GetInOperand(0).AsString()) != 0) {
        to_be_killed.push_back(&inst);
      }
    }
  }

  for (Instruction* inst : to_be_killed) {
    context()->KillInst(inst);
    changed = true;
  }

  // The replacements that take place use instructions that are missing before
  // SPIR-V 1.3. If we changed something, we will have to make sure the version
  // is at least SPIR-V 1.3 to make sure those instruction can be used.
  if (changed) {
    uint32_t version = get_module()->version();
    if (version < 0x00010300 /*1.3*/) {
      get_module()->set_version(0x00010300);
    }
  }
  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}